

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
          (SmallVector<slang::analysis::DataFlowState,_2UL> *this,Base *other)

{
  move_iterator<slang::analysis::DataFlowState_*> first;
  size_type sVar1;
  
  (this->super_SmallVectorBase<slang::analysis::DataFlowState>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::analysis::DataFlowState>).firstElement;
  (this->super_SmallVectorBase<slang::analysis::DataFlowState>).len = 0;
  (this->super_SmallVectorBase<slang::analysis::DataFlowState>).cap = 0;
  first._M_current = other->data_;
  if (first._M_current != (DataFlowState *)other->firstElement) {
    other->data_ = (pointer)0x0;
    (this->super_SmallVectorBase<slang::analysis::DataFlowState>).data_ = first._M_current;
    sVar1 = other->len;
    other->len = 0;
    (this->super_SmallVectorBase<slang::analysis::DataFlowState>).len = sVar1;
    sVar1 = other->cap;
    other->cap = 0;
    (this->super_SmallVectorBase<slang::analysis::DataFlowState>).cap = sVar1;
    return;
  }
  (this->super_SmallVectorBase<slang::analysis::DataFlowState>).cap = 2;
  SmallVectorBase<slang::analysis::DataFlowState>::
  append<std::move_iterator<slang::analysis::DataFlowState_*>_>
            (&this->super_SmallVectorBase<slang::analysis::DataFlowState>,first,
             first._M_current + other->len);
  SmallVectorBase<slang::analysis::DataFlowState>::clear(other);
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }